

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdrloader.cpp
# Opt level: O2

bool oldDecrunch(RGBE *scanline,int len,FILE *file)

{
  int iVar1;
  uint uVar2;
  
LAB_001dd4d5:
  uVar2 = 0;
  do {
    if (len < 1) {
LAB_001dd559:
      return len < 1;
    }
    iVar1 = fgetc((FILE *)file);
    (*scanline)[0] = (uchar)iVar1;
    iVar1 = fgetc((FILE *)file);
    (*scanline)[1] = (uchar)iVar1;
    iVar1 = fgetc((FILE *)file);
    (*scanline)[2] = (uchar)iVar1;
    iVar1 = fgetc((FILE *)file);
    (*scanline)[3] = (uchar)iVar1;
    iVar1 = feof((FILE *)file);
    if (iVar1 != 0) goto LAB_001dd559;
    if ((((*scanline)[0] != '\x01') || ((*scanline)[1] != '\x01')) || ((*scanline)[2] != '\x01'))
    break;
    for (iVar1 = (uint)(*scanline)[3] << (uVar2 & 0x1f); 0 < iVar1; iVar1 = iVar1 + -1) {
      len = len + -1;
      *scanline = scanline[-1];
      scanline = scanline + 1;
    }
    uVar2 = uVar2 + 8;
  } while( true );
  scanline = scanline + 1;
  len = len + -1;
  goto LAB_001dd4d5;
}

Assistant:

bool oldDecrunch(RGBE *scanline, int len, FILE *file)
{
	int i;
	int rshift = 0;
	
	while (len > 0) {
		scanline[0][R] = fgetc(file);
		scanline[0][G] = fgetc(file);
		scanline[0][B] = fgetc(file);
		scanline[0][E] = fgetc(file);
		if (feof(file))
			return false;

		if (scanline[0][R] == 1 &&
			scanline[0][G] == 1 &&
			scanline[0][B] == 1) {
			for (i = scanline[0][E] << rshift; i > 0; i--) {
				memcpy(&scanline[0][0], &scanline[-1][0], 4);
				scanline++;
				len--;
			}
			rshift += 8;
		}
		else {
			scanline++;
			len--;
			rshift = 0;
		}
	}
	return true;
}